

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O0

void __thiscall Corrade::Utility::JsonWriter::finalizeValue(JsonWriter *this)

{
  Array<char,_void_(*)(char_*,_unsigned_long)> *array;
  State *pSVar1;
  size_t sVar2;
  Pair<unsigned_long,_unsigned_long> *pPVar3;
  unsigned_long *puVar4;
  type values;
  State *state;
  JsonWriter *this_local;
  
  pSVar1 = Containers::Pointer<Corrade::Utility::JsonWriter::State>::operator*(&this->_state);
  sVar2 = Containers::
          Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
          ::size(&pSVar1->levels);
  if (sVar2 == 1) {
    array = (Array<char,_void_(*)(char_*,_unsigned_long)> *)(pSVar1->finalNewlineNull)._data;
    values._size = (size_t)array;
    values._data = (char *)(pSVar1->finalNewlineNull)._size;
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              ((Containers *)&pSVar1->out,array,values);
    pSVar1->expecting = DocumentEnd;
  }
  else {
    pPVar3 = Containers::
             Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
             ::back(&pSVar1->levels);
    puVar4 = Containers::Pair<unsigned_long,_unsigned_long>::second(pPVar3);
    if (*puVar4 == 0xffffffffffffffff) {
      pSVar1->expecting = ObjectKeyOrEnd;
      pSVar1->needsCommaBefore = true;
    }
    else {
      pPVar3 = Containers::
               Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
               ::back(&pSVar1->levels);
      puVar4 = Containers::Pair<unsigned_long,_unsigned_long>::second(pPVar3);
      *puVar4 = *puVar4 + 1;
      if (pSVar1->expecting != CompactArrayValueOrArrayEnd) {
        pSVar1->expecting = ArrayValueOrArrayEnd;
      }
      pSVar1->needsCommaBefore = true;
    }
  }
  return;
}

Assistant:

void JsonWriter::finalizeValue() {
    State& state = *_state;

    /* If we're at the root or got back to it after ending an object or array,
       finalize the document */
    if(state.levels.size() == 1) {
        /* Add a \n if we're wrapping and a \0. We can't arrayRemoveSuffix() it
           to make it sentinel because that would trigger ASAN complaint when
           it gets accessed, so instead the size has to be patched in
           toString() and toFile(). */
        /** @todo drop workarounds once growable String exists */
        arrayAppend(state.out, state.finalNewlineNull);

        /* Not expecting any more JSON after this point */
        state.expecting = Expecting::DocumentEnd;

    /* Otherwise expect either an array value or an object key depending on
       where we ended up. If it's an array value, increase the array size
       counter for the value we just wrote. */
    } else if(state.levels.back().second() != ~std::size_t{}) {
        ++state.levels.back().second();
        if(state.expecting != Expecting::CompactArrayValueOrArrayEnd)
            state.expecting = Expecting::ArrayValueOrArrayEnd;
        state.needsCommaBefore = true;
    } else {
        state.expecting = Expecting::ObjectKeyOrEnd;
        state.needsCommaBefore = true;
    }
}